

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_vectors.h
# Opt level: O0

Bitvec08x16 __thiscall Bitvec08x16::ClearLowBit(Bitvec08x16 *this)

{
  longlong extraout_RDX;
  undefined1 (*in_RSI) [16];
  Bitvec08x16 *in_RDI;
  undefined1 auVar1 [16];
  Bitvec08x16 BVar2;
  __m128i one;
  __m128i cmp;
  __m128i local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined4 local_3c;
  undefined1 local_38 [16];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_68 = *(undefined8 *)*in_RSI;
  uStack_60 = *(undefined8 *)(*in_RSI + 8);
  local_58 = (undefined1  [16])0x0;
  local_78 = 0;
  uStack_70 = 0;
  local_d8 = vpcmpgtq_avx(*in_RSI,ZEXT816(0));
  local_a8 = vpslldq_avx(local_d8,1);
  local_3c = 0x3f;
  local_b8 = vpsrlq_avx(local_d8,ZEXT416(0x3f));
  auVar1 = vpternlogq_avx512vl(local_a8,local_a8,local_a8,0xf);
  local_e8 = vpand_avx(auVar1,local_b8);
  local_88 = *(undefined8 *)*in_RSI;
  uStack_80 = *(undefined8 *)(*in_RSI + 8);
  local_18 = *(undefined8 *)*in_RSI;
  uStack_10 = *(undefined8 *)(*in_RSI + 8);
  local_28 = local_e8._0_8_;
  uStack_20 = local_e8._8_8_;
  local_98 = vpsubq_avx(*in_RSI,local_e8);
  local_f8 = (__m128i)vpand_avx(*in_RSI,local_98);
  local_38 = local_d8;
  Bitvec08x16(in_RDI,&local_f8);
  BVar2.vec[1] = extraout_RDX;
  BVar2.vec[0] = (longlong)in_RDI;
  return (Bitvec08x16)BVar2.vec;
}

Assistant:

inline Bitvec08x16 ClearLowBit() const {
#ifdef __SSE4_2__
        __m128i cmp = _mm_cmpgt_epi64(vec, _mm_setzero_si128());
#else
        __m128i cmp = _mm_cmpgt_epi32(vec, _mm_setzero_si128());
        cmp = _mm_or_si128(cmp, _mm_shuffle_epi32(cmp, 0b10110001));
#endif
        __m128i one = _mm_andnot_si128(_mm_slli_si128(cmp, 1), _mm_srli_epi64(cmp, 63));
        return _mm_and_si128(vec, _mm_sub_epi64(vec, one));
    }